

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O3

int s_sha1_compress(sha1_state *md,uchar *buf)

{
  ulong32 uVar1;
  ulong32 uVar2;
  ulong32 uVar3;
  ulong32 uVar4;
  ulong32 uVar5;
  long lVar6;
  ulong32 uVar7;
  long lVar8;
  uint uVar9;
  ulong32 uVar10;
  uint uVar11;
  ulong32 uVar12;
  uint uVar13;
  uint uVar14;
  ulong32 uVar15;
  ulong32 uVar16;
  uint uVar17;
  uint auStack_1b8 [8];
  uint auStack_198 [5];
  uint auStack_184 [85];
  
  lVar8 = 0;
  do {
    uVar11 = *(uint *)(buf + lVar8 * 4);
    auStack_184[lVar8 + 3] =
         uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x10);
  uVar1 = md->state[0];
  uVar2 = md->state[1];
  uVar3 = md->state[2];
  uVar4 = md->state[3];
  uVar5 = md->state[4];
  lVar8 = 0x10;
  do {
    uVar11 = auStack_198[lVar8] ^ auStack_184[lVar8] ^ auStack_1b8[lVar8 + 2] ^ auStack_1b8[lVar8];
    auStack_184[lVar8 + 3] = uVar11 << 1 | (uint)((int)uVar11 < 0);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x50);
  lVar8 = 0;
  uVar15 = uVar5;
  uVar7 = uVar4;
  uVar10 = uVar3;
  uVar16 = uVar2;
  uVar12 = uVar1;
  do {
    uVar13 = uVar12;
    uVar11 = uVar10;
    uVar9 = uVar7;
    lVar6 = lVar8 + 3;
    lVar8 = lVar8 + 1;
    uVar12 = ((uVar9 ^ uVar11) & uVar16 ^ uVar9) + (uVar13 << 5 | uVar13 >> 0x1b) + uVar15 +
             auStack_184[lVar6] + 0x5a827999;
    uVar10 = uVar16 << 0x1e | uVar16 >> 2;
    uVar15 = uVar9;
    uVar7 = uVar11;
    uVar16 = uVar13;
  } while (lVar8 != 0x14);
  lVar8 = 0x14;
  do {
    uVar17 = uVar11;
    uVar14 = uVar12;
    uVar11 = uVar10;
    lVar6 = lVar8 + 3;
    lVar8 = lVar8 + 1;
    uVar12 = (uVar11 ^ uVar13 ^ uVar17) + (uVar14 << 5 | uVar14 >> 0x1b) + uVar9 +
             auStack_184[lVar6] + 0x6ed9eba1;
    uVar10 = uVar13 << 0x1e | uVar13 >> 2;
    uVar13 = uVar14;
    uVar9 = uVar17;
  } while (lVar8 != 0x28);
  lVar8 = 0x28;
  do {
    uVar9 = uVar11;
    uVar13 = uVar12;
    uVar11 = uVar10;
    lVar6 = lVar8 + 3;
    lVar8 = lVar8 + 1;
    uVar12 = auStack_184[lVar6] +
             ((uVar11 | uVar14) & uVar9 | uVar11 & uVar14) + (uVar13 << 5 | uVar13 >> 0x1b) + uVar17
             + 0x8f1bbcdc;
    uVar10 = uVar14 << 0x1e | uVar14 >> 2;
    uVar14 = uVar13;
    uVar17 = uVar9;
  } while (lVar8 != 0x3c);
  lVar8 = 0x3c;
  do {
    uVar17 = uVar11;
    uVar14 = uVar12;
    uVar11 = uVar10;
    lVar6 = lVar8 + 3;
    lVar8 = lVar8 + 1;
    uVar12 = (uVar11 ^ uVar13 ^ uVar17) + (uVar14 << 5 | uVar14 >> 0x1b) + uVar9 +
             auStack_184[lVar6] + 0xca62c1d6;
    uVar10 = uVar13 << 0x1e | uVar13 >> 2;
    uVar13 = uVar14;
    uVar9 = uVar17;
  } while (lVar8 != 0x50);
  md->state[0] = uVar12 + uVar1;
  md->state[1] = uVar14 + uVar2;
  md->state[2] = uVar10 + uVar3;
  md->state[3] = uVar11 + uVar4;
  md->state[4] = uVar17 + uVar5;
  return uVar5;
}

Assistant:

static int s_sha1_compress(struct sha1_state *md, const unsigned char *buf)
{
    ulong32 a,b,c,d,e,W[80],i;
    ulong32 t;

    /* copy the state into 512-bits into W[0..15] */
    for (i = 0; i < 16; i++) {
        LOAD32H(W[i], buf + (4*i));
    }

    /* copy state */
    a = md->state[0];
    b = md->state[1];
    c = md->state[2];
    d = md->state[3];
    e = md->state[4];

    /* expand it */
    for (i = 16; i < 80; i++) {
        W[i] = ROL(W[i-3] ^ W[i-8] ^ W[i-14] ^ W[i-16], 1);
    }

    /* compress */
    /* round one */
    #define FF0(a,b,c,d,e,i) e = (ROLc(a, 5) + F0(b,c,d) + e + W[i] + 0x5a827999UL); b = ROLc(b, 30);
    #define FF1(a,b,c,d,e,i) e = (ROLc(a, 5) + F1(b,c,d) + e + W[i] + 0x6ed9eba1UL); b = ROLc(b, 30);
    #define FF2(a,b,c,d,e,i) e = (ROLc(a, 5) + F2(b,c,d) + e + W[i] + 0x8f1bbcdcUL); b = ROLc(b, 30);
    #define FF3(a,b,c,d,e,i) e = (ROLc(a, 5) + F3(b,c,d) + e + W[i] + 0xca62c1d6UL); b = ROLc(b, 30);

    for (i = 0; i < 20; ) {
       FF0(a,b,c,d,e,i++); t = e; e = d; d = c; c = b; b = a; a = t;
    }
    for (; i < 40; ) {
       FF1(a,b,c,d,e,i++); t = e; e = d; d = c; c = b; b = a; a = t;
    }
    for (; i < 60; ) {
       FF2(a,b,c,d,e,i++); t = e; e = d; d = c; c = b; b = a; a = t;
    }
    for (; i < 80; ) {
       FF3(a,b,c,d,e,i++); t = e; e = d; d = c; c = b; b = a; a = t;
    }

    #undef FF0
    #undef FF1
    #undef FF2
    #undef FF3

    /* store */
    md->state[0] = md->state[0] + a;
    md->state[1] = md->state[1] + b;
    md->state[2] = md->state[2] + c;
    md->state[3] = md->state[3] + d;
    md->state[4] = md->state[4] + e;

    return 0;
}